

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

TestFactoryBase * __thiscall
testing::internal::TestMetaFactory<DriverTest_Glob_Test>::CreateTestFactory
          (TestMetaFactory<DriverTest_Glob_Test> *this,ParamType *parameter)

{
  pointer pcVar1;
  TestFactoryBase *pTVar2;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  pTVar2 = (TestFactoryBase *)operator_new(0x28);
  pcVar1 = (parameter->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + parameter->_M_string_length);
  pTVar2->_vptr_TestFactoryBase = (_func_int **)&PTR__ParameterizedTestFactory_00173060;
  pTVar2[1]._vptr_TestFactoryBase = (_func_int **)(pTVar2 + 3);
  std::__cxx11::string::_M_construct<char*>((string *)(pTVar2 + 1),local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return pTVar2;
}

Assistant:

virtual TestFactoryBase* CreateTestFactory(ParamType parameter) {
    return new ParameterizedTestFactory<TestCase>(parameter);
  }